

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledPixel.cxx
# Opt level: O0

PixelStyle SSD1306::oppositeStyle(PixelStyle style)

{
  PixelStyle opposite;
  PixelStyle style_local;
  
  opposite = None;
  switch(style) {
  case Set:
    opposite = Unset;
    break;
  case Unset:
    opposite = Set;
    break;
  case Xor:
    opposite = Xor;
    break;
  case None:
    opposite = Xor;
  }
  return opposite;
}

Assistant:

SSD1306::PixelStyle
SSD1306::oppositeStyle(
    PixelStyle style)
{
    PixelStyle opposite{PixelStyle::None};

    switch (style)
    {
    case PixelStyle::Set:

        opposite = PixelStyle::Unset;
        break;

    case PixelStyle::Unset:

        opposite = PixelStyle::Set;
        break;

    case PixelStyle::Xor:

        opposite = PixelStyle::Xor;
        break;

    case PixelStyle::None:

        opposite = PixelStyle::Xor;
        break;
    }

    return opposite;
}